

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex_art.hpp
# Opt level: O0

bool __thiscall
unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::empty
          (mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *this)

{
  bool bVar1;
  lock_guard<std::mutex> local_18;
  lock_guard<std::mutex> guard;
  mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *this_local;
  
  guard._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard(&local_18,&this->mutex);
  bVar1 = db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::empty(&this->db_);
  std::lock_guard<std::mutex>::~lock_guard(&local_18);
  return bVar1;
}

Assistant:

[[nodiscard]] auto empty() const {
    const std::lock_guard guard{mutex};
    return db_.empty();
  }